

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O3

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc,int bit)

{
  long lVar1;
  jpc_mqstate_t *pjVar2;
  long lVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  jas_stream_t *pjVar11;
  uint uVar12;
  sbyte sVar13;
  uint_fast32_t uVar14;
  
  iVar6 = jas_getdbglevel();
  if (99 < iVar6) {
    jas_eprintf("jpc_mqenc_putbit(%p, %d)\n",mqenc,bit);
  }
  pjVar2 = *mqenc->curctx;
  uVar10 = pjVar2->qeval;
  uVar9 = mqenc->areg - uVar10;
  if ((uint)pjVar2->mps == bit) {
    mqenc->areg = uVar9;
    if ((short)uVar9 < 0) {
      mqenc->creg = mqenc->creg + uVar10;
    }
    else {
      jpc_mqenc_codemps2(mqenc);
    }
  }
  else {
    uVar7 = uVar10;
    uVar8 = 0;
    if (uVar9 < uVar10) {
      uVar7 = uVar9;
      uVar8 = uVar10;
    }
    uVar8 = uVar8 + mqenc->creg;
    *mqenc->curctx = pjVar2->nlps;
    uVar14 = mqenc->ctreg;
    do {
      mqenc->areg = uVar7 * 2;
      uVar10 = uVar8 * 2;
      mqenc->creg = uVar10;
      uVar14 = uVar14 - 1;
      mqenc->ctreg = uVar14;
      if (uVar14 == 0) {
        lVar3 = mqenc->outbuf;
        if (lVar3 == 0xff) {
LAB_00123a7e:
          pjVar11 = mqenc->out;
          if ((pjVar11->flags_ & 7U) == 0) {
            if ((-1 < pjVar11->rwlimit_) && (pjVar11->rwlimit_ <= pjVar11->rwcnt_)) {
              pjVar11->flags_ = pjVar11->flags_ | 4;
              goto LAB_00123a8d;
            }
            *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
            iVar6 = pjVar11->cnt_;
            pjVar11->cnt_ = iVar6 + -1;
            if (iVar6 < 1) {
              iVar6 = jas_stream_flushbuf(pjVar11,0xff);
              if (iVar6 == -1) goto LAB_00123a8d;
            }
            else {
              pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
              puVar4 = pjVar11->ptr_;
              pjVar11->ptr_ = puVar4 + 1;
              *puVar4 = 0xff;
            }
          }
          else {
LAB_00123a8d:
            *(byte *)&mqenc->err = (byte)mqenc->err | 1;
          }
          uVar14 = 7;
          uVar12 = 0xfffff;
          sVar13 = 0x14;
        }
        else {
          if (((uint)uVar8 >> 0x1a & 1) == 0) {
            uVar14 = 8;
            uVar12 = 0x7ffff;
            sVar13 = 0x13;
            if (lVar3 < 0) goto LAB_00123c17;
            pjVar11 = mqenc->out;
            if ((pjVar11->flags_ & 7U) == 0) {
              if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
                *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
                iVar6 = pjVar11->cnt_;
                pjVar11->cnt_ = iVar6 + -1;
                if (iVar6 < 1) {
                  uVar5 = (uint)lVar3;
LAB_00123c09:
                  uVar14 = 8;
                  sVar13 = 0x13;
                  uVar12 = 0x7ffff;
                  iVar6 = jas_stream_flushbuf(pjVar11,uVar5 & 0xff);
                  if (iVar6 == -1) goto LAB_00123c13;
                }
                else {
                  pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
                  puVar4 = pjVar11->ptr_;
                  pjVar11->ptr_ = puVar4 + 1;
                  *puVar4 = (uchar)lVar3;
                }
                goto LAB_00123c17;
              }
              pjVar11->flags_ = pjVar11->flags_ | 4;
            }
            goto LAB_00123c13;
          }
          lVar1 = lVar3 + 1;
          mqenc->outbuf = lVar1;
          if (lVar1 == 0xff) {
            mqenc->creg = (ulong)((uint)uVar10 & 0x7fffffe);
            goto LAB_00123a7e;
          }
          uVar14 = 8;
          uVar12 = 0x7ffff;
          sVar13 = 0x13;
          if (-2 < lVar3) {
            pjVar11 = mqenc->out;
            if ((pjVar11->flags_ & 7U) == 0) {
              if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
                *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
                iVar6 = pjVar11->cnt_;
                pjVar11->cnt_ = iVar6 + -1;
                if (iVar6 < 1) {
                  uVar5 = (uint)lVar1;
                  goto LAB_00123c09;
                }
                pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
                puVar4 = pjVar11->ptr_;
                pjVar11->ptr_ = puVar4 + 1;
                *puVar4 = (uchar)lVar1;
                goto LAB_00123c17;
              }
              pjVar11->flags_ = pjVar11->flags_ | 4;
            }
LAB_00123c13:
            uVar14 = 8;
            sVar13 = 0x13;
            uVar12 = 0x7ffff;
            *(byte *)&mqenc->err = (byte)mqenc->err | 1;
          }
        }
LAB_00123c17:
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> sVar13 & 0xff;
        uVar10 = (ulong)((uint)mqenc->creg & uVar12);
        mqenc->creg = uVar10;
        mqenc->ctreg = uVar14;
      }
      uVar8 = uVar10;
      uVar7 = mqenc->areg;
    } while (-1 < (short)uVar7);
  }
  return -(uint)(mqenc->err != 0);
}

Assistant:

int jpc_mqenc_putbit(jpc_mqenc_t *mqenc, int bit)
{
	const jpc_mqstate_t *state;
	JAS_DBGLOG(100, ("jpc_mqenc_putbit(%p, %d)\n", mqenc, bit));
	JPC_MQENC_CALL(100, jpc_mqenc_dump(mqenc, stderr));

	state = *(mqenc->curctx);

	if (state->mps == bit) {
		/* Apply the CODEMPS algorithm as defined in the standard. */
		mqenc->areg -= state->qeval;
		if (!(mqenc->areg & 0x8000)) {
			jpc_mqenc_codemps2(mqenc);
		} else {
			mqenc->creg += state->qeval;
		}
	} else {
		/* Apply the CODELPS algorithm as defined in the standard. */
		jpc_mqenc_codelps2(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc->curctx, mqenc);
	}

	return jpc_mqenc_error(mqenc) ? (-1) : 0;
}